

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::StringLiteral>
          (ConstraintExprVisitor *this,StringLiteral *expr)

{
  ExpressionKind EVar1;
  uint uVar2;
  int iVar3;
  Expression *this_00;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar4;
  size_type sVar5;
  long lVar6;
  Type *pTVar7;
  bool bVar8;
  RandMode RVar9;
  SubroutineKind SVar10;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar11;
  Diagnostic *diag;
  SourceLocation SVar12;
  long lVar14;
  DiagCode code;
  ASTContext *this_01;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  byte local_2b;
  SourceLocation SVar13;
  
  if (this->failed != false) goto LAB_0023fb81;
  if (((this->isSoft == true) &&
      (symbol = Expression::getSymbolReference(&expr->super_Expression,true),
      symbol != (Symbol *)0x0)) &&
     (RVar9 = ASTContext::getRandMode(this->context,symbol), RVar9 == RandC)) {
    ASTContext::addDiag(this->context,(DiagCode)0x340008,(expr->super_Expression).sourceRange);
  }
  EVar1 = (expr->super_Expression).kind;
  bVar8 = true;
  if (0x14 < (int)EVar1) {
    switch(EVar1) {
    case OpenRange:
      goto switchD_0023fa71_caseD_1f;
    case Dist:
      local_38 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_30 = local_30 & 0xffffff00;
      this_00 = (Expression *)(expr->value)._M_len;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (this_00,this_00,(DistVarVisitor *)&local_38);
      if ((char)local_30 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x370008,this_00->sourceRange);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_0023fa71_caseD_21;
    case NewCovergroup:
      break;
    default:
      if (EVar1 == Call) {
        SVar10 = CallExpression::getSubroutineKind((CallExpression *)expr);
        if (SVar10 == Task) {
          this_01 = this->context;
          SVar13 = (expr->super_Expression).sourceRange.startLoc;
          SVar12 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x44;
          goto LAB_0023fb78;
        }
        if (*(char *)&expr[1].super_Expression.type.ptr != '\x01') {
          ppSVar11 = std::
                     get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                               ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                 *)&expr->value);
          pSVar4 = *ppSVar11;
          if ((pSVar4->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pSVar4->super_Scope);
          }
          sVar5 = (pSVar4->arguments).size_;
          bVar8 = sVar5 != 0;
          if (bVar8) {
            lVar14 = 0;
            do {
              lVar6 = *(long *)((long)(pSVar4->arguments).data_ + lVar14);
              iVar3 = *(int *)(lVar6 + 0x90);
              if (iVar3 == 3) {
                if ((*(byte *)(lVar6 + 0x8c) & 1) == 0) goto LAB_0023fc08;
              }
              else if (iVar3 == 1) {
LAB_0023fc08:
                ASTContext::addDiag(this->context,(DiagCode)0x2d0008,
                                    (expr->super_Expression).sourceRange);
                this->failed = true;
                break;
              }
              lVar14 = lVar14 + 8;
              bVar8 = sVar5 << 3 != lVar14;
            } while (bVar8);
          }
          if (bVar8) goto LAB_0023fb81;
        }
      }
    }
    goto switchD_0023fa44_caseD_5;
  }
  switch(EVar1) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_38,(SVIntStorage *)&(expr->value)._M_str);
    goto LAB_0023fb14;
  case RealLiteral:
  case TimeLiteral:
    this_01 = this->context;
    SVar13 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2a;
    break;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_38);
LAB_0023fb14:
    if ((0x40 < local_30 || (local_2b & 1) != 0) && ((void *)local_38.val != (void *)0x0)) {
      operator_delete__(local_38.pVal);
    }
    if ((local_2b & 1) == 0) {
      return true;
    }
    this_01 = this->context;
    SVar13 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x49;
    break;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case NamedValue:
  case HierarchicalValue:
  case UnaryOp:
    goto switchD_0023fa44_caseD_5;
  case BinaryOp:
    uVar2 = (uint)(expr->value)._M_len;
    if ((0x12 < uVar2) || ((0x61800U >> (uVar2 & 0x1f) & 1) == 0)) goto switchD_0023fa44_caseD_5;
switchD_0023fa71_caseD_21:
    this_01 = this->context;
    SVar13 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x13;
    break;
  default:
    if (EVar1 == Streaming) goto switchD_0023fa71_caseD_21;
switchD_0023fa44_caseD_5:
    pTVar7 = (expr->super_Expression).type.ptr;
    if (pTVar7 == (Type *)0x0) {
LAB_0023fc71:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                );
    }
    bVar8 = Type::isValidForRand(pTVar7,Rand);
    if (bVar8) {
      return true;
    }
    diag = ASTContext::addDiag(this->context,(DiagCode)0x290008,(expr->super_Expression).sourceRange
                              );
    pTVar7 = (expr->super_Expression).type.ptr;
    if (pTVar7 == (Type *)0x0) goto LAB_0023fc71;
    ast::operator<<(diag,pTVar7);
    goto LAB_0023fb7d;
  }
LAB_0023fb78:
  sourceRange.endLoc = SVar12;
  sourceRange.startLoc = SVar13;
  ASTContext::addDiag(this_01,code,sourceRange);
LAB_0023fb7d:
  this->failed = true;
LAB_0023fb81:
  bVar8 = false;
switchD_0023fa71_caseD_1f:
  return bVar8;
}

Assistant:

bool visit(const T& expr) {
        if (failed)
            return false;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (isSoft) {
                if (auto sym = expr.getSymbolReference()) {
                    RandMode mode = context.getRandMode(*sym);
                    if (mode == RandMode::RandC)
                        context.addDiag(diag::RandCInSoft, expr.sourceRange);
                }
            }

            if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {
                    expr.visitExprs(*this);
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    switch (expr.template as<BinaryExpression>().op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return visitInvalid(expr);
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::OpenRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return visitInvalid(expr);
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return visitInvalid(expr);
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!expr.type->isValidForRand(RandMode::Rand)) {
                context.addDiag(diag::NonIntegralConstraintExpr, expr.sourceRange) << *expr.type;
                return visitInvalid(expr);
            }
        }

        return true;
    }